

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_sign(void *verify_ctx,ptls_iovec_t data,ptls_iovec_t signature)

{
  EVP_PKEY_CTX *pEVar1;
  int iVar2;
  EVP_MD_CTX *ctx_00;
  EVP_MD *pEVar3;
  int local_4c;
  EVP_PKEY_CTX *pEStack_48;
  int ret;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_MD_CTX *ctx;
  EVP_PKEY *key;
  void *verify_ctx_local;
  ptls_iovec_t signature_local;
  ptls_iovec_t data_local;
  
  signature_local.base = (uint8_t *)signature.len;
  verify_ctx_local = signature.base;
  signature_local.len = (size_t)data.base;
  pkey_ctx = (EVP_PKEY_CTX *)0x0;
  pEStack_48 = (EVP_PKEY_CTX *)0x0;
  local_4c = 0;
  ctx = (EVP_MD_CTX *)verify_ctx;
  key = (EVP_PKEY *)verify_ctx;
  if ((uint8_t *)signature_local.len != (uint8_t *)0x0) {
    ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    pkey_ctx = (EVP_PKEY_CTX *)ctx_00;
    if (ctx_00 == (EVP_MD_CTX *)0x0) {
      local_4c = 0x201;
    }
    else {
      pEVar3 = EVP_sha256();
      iVar2 = EVP_DigestVerifyInit
                        (ctx_00,&stack0xffffffffffffffb8,pEVar3,(ENGINE *)0x0,(EVP_PKEY *)ctx);
      if (iVar2 == 1) {
        iVar2 = EVP_PKEY_get_id(ctx);
        if (iVar2 == 6) {
          iVar2 = EVP_PKEY_CTX_set_rsa_padding(pEStack_48,6);
          if (iVar2 != 1) {
            local_4c = 0x203;
            goto LAB_0011265f;
          }
          iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pEStack_48,0xffffffff);
          pEVar1 = pEStack_48;
          if (iVar2 != 1) {
            local_4c = 0x203;
            goto LAB_0011265f;
          }
          pEVar3 = EVP_sha256();
          iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(pEVar1,pEVar3);
          if (iVar2 != 1) {
            local_4c = 0x203;
            goto LAB_0011265f;
          }
        }
        iVar2 = EVP_DigestVerifyUpdate(pkey_ctx,signature_local.len,data.len);
        if (iVar2 == 1) {
          iVar2 = EVP_DigestVerifyFinal
                            ((EVP_MD_CTX *)pkey_ctx,(uchar *)verify_ctx_local,
                             (size_t)signature_local.base);
          if (iVar2 == 1) {
            local_4c = 0;
          }
          else {
            local_4c = 0x33;
          }
        }
        else {
          local_4c = 0x203;
        }
      }
      else {
        local_4c = 0x203;
      }
    }
  }
LAB_0011265f:
  if (pkey_ctx != (EVP_PKEY_CTX *)0x0) {
    EVP_MD_CTX_free(pkey_ctx);
  }
  EVP_PKEY_free((EVP_PKEY *)ctx);
  return local_4c;
}

Assistant:

static int verify_sign(void *verify_ctx, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_DigestVerifyInit(ctx, &pkey_ctx, EVP_sha256(), NULL, key) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
        if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, EVP_sha256()) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    }
    if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}